

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessageTest.cpp
# Opt level: O0

void __thiscall
AssertionMessageTest_formatInt_Test::TestBody(AssertionMessageTest_formatInt_Test *this)

{
  bool bVar1;
  AssertionMessage *pAVar2;
  char *message_00;
  AssertHelper local_a0;
  Message local_98;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  AssertionMessage message;
  int64_t int64Value;
  short local_46;
  int32_t int32Value;
  int16_t int16Value;
  allocator local_31;
  undefined1 local_30 [8];
  string expectedMessage;
  AssertionMessageTest_formatInt_Test *this_local;
  
  expectedMessage.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"32767 2147483647 9223372036854775807",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_46 = 0x7fff;
  int64Value._4_4_ = 0x7fffffff;
  message.stream_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x7fffffffffffffff;
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&gtest_ar.message_);
  pAVar2 = cppassert::internal::AssertionMessage::operator<<
                     ((AssertionMessage *)&gtest_ar.message_,&local_46);
  pAVar2 = cppassert::internal::AssertionMessage::operator<<(pAVar2,(char (*) [2])0x1b15b1);
  pAVar2 = cppassert::internal::AssertionMessage::operator<<(pAVar2,(int *)((long)&int64Value + 4));
  pAVar2 = cppassert::internal::AssertionMessage::operator<<(pAVar2,(char (*) [2])0x1b15b1);
  cppassert::internal::AssertionMessage::operator<<(pAVar2,(long *)&message);
  cppassert::internal::AssertionMessage::str_abi_cxx11_
            (&local_90,(AssertionMessage *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_70,"expectedMessage","message.str()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_90
            );
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionMessageTest.cpp"
               ,0x34,message_00);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  cppassert::internal::AssertionMessage::~AssertionMessage((AssertionMessage *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(AssertionMessageTest, formatInt)
{
    const std::string expectedMessage("32767 2147483647 9223372036854775807");

    std::int16_t int16Value = 32767;
    std::int32_t int32Value = 2147483647;
    std::int64_t int64Value = 9223372036854775807;

    cppassert::internal::AssertionMessage message;
    message<<int16Value<<" "<<int32Value<<" "<<int64Value;
    EXPECT_EQ(expectedMessage, message.str());
}